

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

int ClipperLib::PointInPolygon(IntPoint *pt,OutPt *op)

{
  double dVar1;
  double d_1;
  double d;
  OutPt *startOp;
  OutPt *pOStack_20;
  int result;
  OutPt *op_local;
  IntPoint *pt_local;
  
  startOp._4_4_ = 0;
  pOStack_20 = op;
  while (((pOStack_20->Next->Pt).Y != pt->Y ||
         (((pOStack_20->Next->Pt).X != pt->X &&
          (((pOStack_20->Pt).Y != pt->Y ||
           (pt->X < (pOStack_20->Next->Pt).X != (pOStack_20->Pt).X < pt->X))))))) {
    if ((pOStack_20->Pt).Y < pt->Y != (pOStack_20->Next->Pt).Y < pt->Y) {
      if ((pOStack_20->Pt).X < pt->X) {
        if (pt->X < (pOStack_20->Next->Pt).X) {
          dVar1 = (double)((pOStack_20->Pt).X - pt->X) * (double)((pOStack_20->Next->Pt).Y - pt->Y)
                  + -((double)((pOStack_20->Next->Pt).X - pt->X) *
                     (double)((pOStack_20->Pt).Y - pt->Y));
          if ((dVar1 == 0.0) && (!NAN(dVar1))) {
            return -1;
          }
          if (0.0 < dVar1 == (pOStack_20->Pt).Y < (pOStack_20->Next->Pt).Y) {
            startOp._4_4_ = 1 - startOp._4_4_;
          }
        }
      }
      else if (pt->X < (pOStack_20->Next->Pt).X) {
        startOp._4_4_ = 1 - startOp._4_4_;
      }
      else {
        dVar1 = (double)((pOStack_20->Pt).X - pt->X) * (double)((pOStack_20->Next->Pt).Y - pt->Y) +
                -((double)((pOStack_20->Next->Pt).X - pt->X) * (double)((pOStack_20->Pt).Y - pt->Y))
        ;
        if ((dVar1 == 0.0) && (!NAN(dVar1))) {
          return -1;
        }
        if (0.0 < dVar1 == (pOStack_20->Pt).Y < (pOStack_20->Next->Pt).Y) {
          startOp._4_4_ = 1 - startOp._4_4_;
        }
      }
    }
    pOStack_20 = pOStack_20->Next;
    if (op == pOStack_20) {
      return startOp._4_4_;
    }
  }
  return -1;
}

Assistant:

int PointInPolygon (const IntPoint &pt, OutPt *op)
{
  //returns 0 if false, +1 if true, -1 if pt ON polygon boundary
  int result = 0;
  OutPt* startOp = op;
  for(;;)
  {
    if (op->Next->Pt.Y == pt.Y)
    {
        if ((op->Next->Pt.X == pt.X) || (op->Pt.Y == pt.Y && 
          ((op->Next->Pt.X > pt.X) == (op->Pt.X < pt.X)))) return -1;
    }
    if ((op->Pt.Y < pt.Y) != (op->Next->Pt.Y < pt.Y))
    {
      if (op->Pt.X >= pt.X)
      {
        if (op->Next->Pt.X > pt.X) result = 1 - result;
        else
        {
          double d = (double)(op->Pt.X - pt.X) * (op->Next->Pt.Y - pt.Y) - 
            (double)(op->Next->Pt.X - pt.X) * (op->Pt.Y - pt.Y);
          if (!d) return -1;
          if ((d > 0) == (op->Next->Pt.Y > op->Pt.Y)) result = 1 - result;
        }
      } else
      {
        if (op->Next->Pt.X > pt.X)
        {
          double d = (double)(op->Pt.X - pt.X) * (op->Next->Pt.Y - pt.Y) - 
            (double)(op->Next->Pt.X - pt.X) * (op->Pt.Y - pt.Y);
          if (!d) return -1;
          if ((d > 0) == (op->Next->Pt.Y > op->Pt.Y)) result = 1 - result;
        }
      }
    } 
    op = op->Next;
    if (startOp == op) break;
  } 
  return result;
}